

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall CPU::MOS6502::State::State(State *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Struct *str;
  Struct *str_2;
  Struct *str_1;
  string local_48;
  
  (this->super_StructImpl<CPU::MOS6502::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a19e8;
  Registers::Registers(&this->registers);
  Inputs::Inputs(&this->inputs);
  ExecutionState::ExecutionState(&this->execution_state);
  if (Reflection::StructImpl<CPU::MOS6502::State>::contents__abi_cxx11_._M_h._M_element_count == 0)
  {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"registers","");
    Reflection::StructImpl<CPU::MOS6502::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<CPU::MOS6502::State>,(Struct *)&this->registers,&local_48,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"execution_state","");
    Reflection::StructImpl<CPU::MOS6502::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<CPU::MOS6502::State>,(Struct *)&this->execution_state,
               &local_48,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"inputs","");
    Reflection::StructImpl<CPU::MOS6502::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<CPU::MOS6502::State>,(Struct *)&this->inputs,&local_48,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State::State() {
	if(needs_declare()) {
		DeclareField(registers);
		DeclareField(execution_state);
		DeclareField(inputs);
	}
}